

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

int __thiscall
kratos::Generator::clone(Generator *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  size_t *this_00;
  Generator *this_01;
  long *plVar1;
  string *psVar2;
  _func_int **pp_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  char cVar6;
  byte bVar7;
  uint32_t width;
  _Rb_tree_node_base *p_Var8;
  Port *this_02;
  _Base_ptr p_Var9;
  undefined1 local_b0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78 [3];
  undefined1 local_60 [8];
  shared_ptr<kratos::Param> param;
  undefined1 local_48 [8];
  shared_ptr<kratos::Port> port;
  
  std::make_shared<kratos::Generator,kratos::Context*&,std::__cxx11::string&>
            ((Context **)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__fn + 0xf8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b0,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(__fn + 0x130));
  param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  for (p_Var8 = *(_Rb_tree_node_base **)(__fn + 0x178);
      p_Var8 != (_Rb_tree_node_base *)(__fn + 0x168);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    this_01 = (Generator *)(this->super_IRNode)._vptr_IRNode;
    width = (**(code **)(**(long **)(p_Var8 + 2) + 0x38))();
    parameter(this_01,(string *)(p_Var8 + 1),width,*(bool *)(*(long *)(p_Var8 + 2) + 0xf0));
  }
  this_00 = &port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
  port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  for (p_Var9 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      _Var5._M_pi = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi,
      _Var4._M_pi = param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi, p_Var9 != (_Rb_tree_node_base *)&port_names;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    get_port((Generator *)local_48,
             (string *)
             param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    this_02 = Generator::port((Generator *)
                              (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base,
                              *(PortDirection *)
                               ((long)&(((pointer)((long)local_48 + 600))->first).field_2 + 8),
                              (string *)(p_Var9 + 1),((pointer)((long)local_48 + 0x78))->second,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              ((long)local_48 + 0xa0),
                              *(PortType *)
                               ((long)&(((pointer)((long)local_48 + 600))->first).field_2 + 0xc),
                              *(bool *)&(((pointer)((long)local_48 + 0xf0))->first)._M_dataplus._M_p
                             );
    plVar1 = (long *)(((pointer)((long)local_48 + 0x1e0))->first)._M_string_length;
    if (plVar1 != (long *)0x0) {
      cVar6 = (**(code **)(*plVar1 + 0xd8))(plVar1);
      if (cVar6 != '\0') {
        psVar2 = (string *)
                 (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base;
        (**(code **)(*(long *)(((pointer)((long)local_48 + 0x1e0))->first)._M_string_length + 0xf8))
                  (this_00);
        get_param((Generator *)local_60,psVar2);
        std::__cxx11::string::~string((string *)this_00);
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Param,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this_00,
                   (__shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2> *)local_60);
        Var::set_width_param(&this_02->super_Var,(shared_ptr<kratos::Var> *)this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&param);
      }
    }
    bVar7 = (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48)->_M_dataplus)._M_p + 0xc0))();
    (*(this_02->super_Var).super_IRNode._vptr_IRNode[0x19])(this_02,(ulong)bVar7);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
  }
  if (*(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        **)&(param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_use_count !=
      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
       *)param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
         _vptr__Sp_counted_base) {
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)((port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1),
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)(port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_vptr__Sp_counted_base[2],
               *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 **)&(param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi[1]._vptr__Sp_counted_base);
  }
  pp_Var3 = (_Var5._M_pi)->_vptr__Sp_counted_base;
  *(undefined1 *)((long)pp_Var3 + 0x2d9) = 1;
  *(undefined1 *)(pp_Var3 + 99) = 1;
  pp_Var3[0x89] = (_func_int *)_Var4._M_pi;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
  return (int)_Var5._M_pi;
}

Assistant:

std::shared_ptr<Generator> Generator::clone() {
    auto generator = std::make_shared<Generator>(context_, name);
    auto port_names = get_port_names();
    // also parameters
    for (auto const &[param_name, param] : params_) {
        generator->parameter(param_name, param->width(), param->is_signed());
    }

    for (auto const &port_name : port_names) {
        auto port = get_port(port_name);
        auto &p = generator->port(port->port_direction(), port_name, port->var_width(),
                                  port->size(), port->port_type(), port->is_signed());
        if (port->width_param() && port->width_param()->is_param()) {
            auto param = generator->get_param(port->width_param()->to_string());
            p.set_width_param(param);
        }
        p.set_is_packed(port->is_packed());
    }

    if (!fn_name_ln.empty()) {
        generator->fn_name_ln.insert(generator->fn_name_ln.end(), fn_name_ln.begin(),
                                     fn_name_ln.end());
    }
    // we won't bother checking stuff
    generator->set_external(true);
    generator->is_cloned_ = true;
    generator->def_instance_ = this;
    return generator;
}